

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::InitializeRead
          (ColumnReader *this,idx_t row_group_idx_p,
          vector<duckdb_parquet::ColumnChunk,_true> *columns,TProtocol *protocol_p)

{
  idx_t iVar1;
  const_reference pvVar2;
  runtime_error *this_00;
  
  pvVar2 = vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                     (columns,this->column_schema->column_index);
  this->chunk = pvVar2;
  this->protocol = protocol_p;
  if (((byte)pvVar2->__isset & 1) == 0) {
    this->chunk_read_offset = (pvVar2->meta_data).data_page_offset;
    if ((((byte)(pvVar2->meta_data).__isset & 4) != 0) &&
       (iVar1 = (pvVar2->meta_data).dictionary_page_offset, 3 < (long)iVar1)) {
      this->chunk_read_offset = iVar1;
    }
    this->group_rows_available = (pvVar2->meta_data).num_values;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_00,"Only inlined data files are supported (no references)");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnReader::InitializeRead(idx_t row_group_idx_p, const vector<ColumnChunk> &columns, TProtocol &protocol_p) {
	D_ASSERT(ColumnIndex() < columns.size());
	chunk = &columns[ColumnIndex()];
	protocol = &protocol_p;
	D_ASSERT(chunk);
	D_ASSERT(chunk->__isset.meta_data);

	if (chunk->__isset.file_path) {
		throw std::runtime_error("Only inlined data files are supported (no references)");
	}

	// ugh. sometimes there is an extra offset for the dict. sometimes it's wrong.
	chunk_read_offset = chunk->meta_data.data_page_offset;
	if (chunk->meta_data.__isset.dictionary_page_offset && chunk->meta_data.dictionary_page_offset >= 4) {
		// this assumes the data pages follow the dict pages directly.
		chunk_read_offset = chunk->meta_data.dictionary_page_offset;
	}
	group_rows_available = chunk->meta_data.num_values;
}